

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDistanceCalculator.cpp
# Opt level: O0

set<int,_std::less<int>,_std::allocator<int>_> *
getWallTags(set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,
           ImportedUgrid *mesh)

{
  int iVar1;
  bool bVar2;
  reference piVar3;
  ostream *this;
  iterator iStack_58;
  int t;
  iterator __end1;
  iterator __begin1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> all_tags;
  ImportedUgrid *mesh_local;
  set<int,_std::less<int>,_std::allocator<int>_> *tags;
  
  all_tags.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)mesh;
  findAllTags((vector<int,_std::allocator<int>_> *)local_30,mesh);
  tellUserTags((vector<int,_std::allocator<int>_> *)local_30);
  getUserTags();
  std::operator<<((ostream *)&std::cout,"Measuring distance to nearest tag: ");
  __end1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(__return_storage_ptr__);
  iStack_58 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(__return_storage_ptr__);
  while (bVar2 = std::operator!=(&__end1,&stack0xffffffffffffffa8), bVar2) {
    piVar3 = std::_Rb_tree_const_iterator<int>::operator*(&__end1);
    iVar1 = *piVar3;
    this = std::operator<<((ostream *)&std::cout," ");
    std::ostream::operator<<(this,iVar1);
    std::_Rb_tree_const_iterator<int>::operator++(&__end1);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::set<int> getWallTags(const Parfait::ImportedUgrid& mesh){
    auto all_tags = findAllTags(mesh);
    tellUserTags(all_tags);
    auto tags = getUserTags();
    std::cout << "Measuring distance to nearest tag: ";
    for(auto t : tags){
        std::cout << " " << t;
    }
    std::cout << std::endl;
    return tags;
}